

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

void __thiscall
flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,HandlerCallInstr *handlerCallInstr)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  
  uVar1 = (ulong)((long)(handlerCallInstr->super_Instr).operands_.
                        super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(handlerCallInstr->super_Instr).operands_.
                       super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3;
  iVar3 = (int)uVar1 + -1;
  if (0 < iVar3) {
    uVar4 = 1;
    do {
      emitLoad(this,(handlerCallInstr->super_Instr).operands_.
                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
    } while ((uVar1 & 0xffffffff) != uVar4);
  }
  sVar2 = ConstantPool::makeNativeHandler
                    (&this->cp_,
                     (IRBuiltinHandler *)
                     *(handlerCallInstr->super_Instr).operands_.
                      super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
  emitInstr(this,HANDLER,(Operand)sVar2,
            (short)((uint)(*(int *)&(handlerCallInstr->super_Instr).operands_.
                                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(handlerCallInstr->super_Instr).operands_.
                                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1);
  if (iVar3 != 0) {
    pop(this,(long)iVar3);
    return;
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(HandlerCallInstr& handlerCallInstr) {
  int argc = handlerCallInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(handlerCallInstr.operand(i));

  emitInstr(Opcode::HANDLER,
      cp_.makeNativeHandler(handlerCallInstr.callee()),
      handlerCallInstr.operands().size() - 1);

  if (argc)
    pop(argc);
}